

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManSave(If_DsdMan_t *p,char *pFileName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *__s;
  int *piVar4;
  word *__ptr;
  size_t sVar5;
  bool bVar6;
  int local_88;
  int local_7c;
  If_DsdObj_t *local_60;
  char *local_58;
  int nBytes;
  FILE *pFile;
  int local_38;
  int Num;
  int v;
  int i;
  word *pTruth;
  Vec_Int_t *vSets;
  If_DsdObj_t *pObj;
  char *pFileName_local;
  If_DsdMan_t *p_local;
  
  local_58 = pFileName;
  if (pFileName == (char *)0x0) {
    local_58 = p->pStore;
  }
  pObj = (If_DsdObj_t *)pFileName;
  pFileName_local = (char *)p;
  __s = fopen(local_58,"wb");
  if (__s == (FILE *)0x0) {
    if (pObj == (If_DsdObj_t *)0x0) {
      local_60 = *(If_DsdObj_t **)pFileName_local;
    }
    else {
      local_60 = pObj;
    }
    printf("Writing DSD manager file \"%s\" has failed.\n",local_60);
  }
  else {
    fwrite("dsd1",4,1,__s);
    pFile._4_4_ = *(int *)(pFileName_local + 8);
    fwrite((void *)((long)&pFile + 4),4,1,__s);
    pFile._4_4_ = *(int *)(pFileName_local + 0xc);
    fwrite((void *)((long)&pFile + 4),4,1,__s);
    pFile._4_4_ = Vec_PtrSize((Vec_Ptr_t *)(pFileName_local + 0x28));
    fwrite((void *)((long)&pFile + 4),4,1,__s);
    for (Num = 2; iVar2 = Num, iVar1 = Vec_PtrSize((Vec_Ptr_t *)(pFileName_local + 0x28)),
        iVar2 < iVar1; Num = Num + 1) {
      vSets = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)(pFileName_local + 0x28),Num);
      pFile._4_4_ = If_DsdObjWordNum((uint)vSets->nSize >> 0x1b);
      fwrite((void *)((long)&pFile + 4),4,1,__s);
      fwrite(vSets,(long)pFile._4_4_ << 3,1,__s);
      if ((vSets->nSize & 7U) == 6) {
        piVar4 = Vec_IntEntryP((Vec_Int_t *)(pFileName_local + 0x48),Num);
        fwrite(piVar4,4,1,__s);
      }
    }
    for (local_38 = 3; local_38 <= *(int *)(pFileName_local + 8); local_38 = local_38 + 1) {
      iVar2 = Vec_MemEntrySize(*(Vec_Mem_t **)(pFileName_local + (long)local_38 * 8 + 0x70));
      pFile._4_4_ = Vec_MemEntryNum(*(Vec_Mem_t **)(pFileName_local + (long)local_38 * 8 + 0x70));
      fwrite((void *)((long)&pFile + 4),4,1,__s);
      Num = 0;
      while( true ) {
        iVar1 = Num;
        iVar3 = Vec_MemEntryNum(*(Vec_Mem_t **)(pFileName_local + (long)local_38 * 8 + 0x70));
        bVar6 = false;
        if (iVar1 < iVar3) {
          _v = Vec_MemReadEntry(*(Vec_Mem_t **)(pFileName_local + (long)local_38 * 8 + 0x70),Num);
          bVar6 = _v != (word *)0x0;
        }
        if (!bVar6) break;
        fwrite(_v,(long)(iVar2 << 3),1,__s);
        Num = Num + 1;
      }
      pFile._4_4_ = Vec_PtrSize(*(Vec_Ptr_t **)(pFileName_local + (long)local_38 * 8 + 0xf0));
      fwrite((void *)((long)&pFile + 4),4,1,__s);
      for (Num = 0; iVar2 = Num,
          iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)(pFileName_local + (long)local_38 * 8 + 0xf0)),
          iVar2 < iVar1; Num = Num + 1) {
        pTruth = (word *)Vec_PtrEntry(*(Vec_Ptr_t **)(pFileName_local + (long)local_38 * 8 + 0xf0),
                                      Num);
        pFile._4_4_ = Vec_IntSize((Vec_Int_t *)pTruth);
        fwrite((void *)((long)&pFile + 4),4,1,__s);
        piVar4 = Vec_IntArray((Vec_Int_t *)pTruth);
        fwrite(piVar4,(long)pFile._4_4_ << 2,1,__s);
      }
    }
    pFile._4_4_ = *(int *)(pFileName_local + 0x26c);
    fwrite((void *)((long)&pFile + 4),4,1,__s);
    pFile._4_4_ = *(int *)(pFileName_local + 0x268);
    fwrite((void *)((long)&pFile + 4),4,1,__s);
    if (*(long *)(pFileName_local + 0x270) == 0) {
      local_7c = 0;
    }
    else {
      local_7c = Vec_WrdSize(*(Vec_Wrd_t **)(pFileName_local + 0x270));
    }
    pFile._4_4_ = local_7c;
    fwrite((void *)((long)&pFile + 4),4,1,__s);
    if (pFile._4_4_ != 0) {
      __ptr = Vec_WrdArray(*(Vec_Wrd_t **)(pFileName_local + 0x270));
      fwrite(__ptr,(long)pFile._4_4_ << 3,1,__s);
    }
    if (*(long *)(pFileName_local + 0x290) == 0) {
      local_88 = 0;
    }
    else {
      sVar5 = strlen(*(char **)(pFileName_local + 0x290));
      local_88 = (int)sVar5;
    }
    pFile._4_4_ = local_88;
    fwrite((void *)((long)&pFile + 4),4,1,__s);
    if (pFile._4_4_ != 0) {
      fwrite(*(void **)(pFileName_local + 0x290),(long)pFile._4_4_,1,__s);
    }
    fclose(__s);
  }
  return;
}

Assistant:

void If_DsdManSave( If_DsdMan_t * p, char * pFileName )
{
    If_DsdObj_t * pObj; 
    Vec_Int_t * vSets;
    word * pTruth; 
    int i, v, Num;
    FILE * pFile = fopen( pFileName ? pFileName : p->pStore, "wb" );
    if ( pFile == NULL )
    {
        printf( "Writing DSD manager file \"%s\" has failed.\n", pFileName ? pFileName : p->pStore );
        return;
    }
    fwrite( DSD_VERSION, 4, 1, pFile );
    Num = p->nVars;
    fwrite( &Num, 4, 1, pFile );
    Num = p->LutSize;
    fwrite( &Num, 4, 1, pFile );
    Num = Vec_PtrSize(&p->vObjs);
    fwrite( &Num, 4, 1, pFile );
    Vec_PtrForEachEntryStart( If_DsdObj_t *, &p->vObjs, pObj, i, 2 )
    {
        Num = If_DsdObjWordNum( pObj->nFans );
        fwrite( &Num, 4, 1, pFile );
        fwrite( pObj, sizeof(word)*Num, 1, pFile );
        if ( pObj->Type == IF_DSD_PRIME )
            fwrite( Vec_IntEntryP(&p->vTruths, i), 4, 1, pFile );
    }
    for ( v = 3; v <= p->nVars; v++ )
    {
        int nBytes = sizeof(word)*Vec_MemEntrySize(p->vTtMem[v]);
        Num = Vec_MemEntryNum(p->vTtMem[v]);
        fwrite( &Num, 4, 1, pFile );
        Vec_MemForEachEntry( p->vTtMem[v], pTruth, i )
            fwrite( pTruth, nBytes, 1, pFile );
        Num = Vec_PtrSize(p->vTtDecs[v]);
        fwrite( &Num, 4, 1, pFile );
        Vec_PtrForEachEntry( Vec_Int_t *, p->vTtDecs[v], vSets, i )
        {
            Num = Vec_IntSize(vSets);
            fwrite( &Num, 4, 1, pFile );
            fwrite( Vec_IntArray(vSets), sizeof(int)*Num, 1, pFile );
        }
    }
    Num = p->nConfigWords;
    fwrite( &Num, 4, 1, pFile );
    Num = p->nTtBits;
    fwrite( &Num, 4, 1, pFile );
    Num = p->vConfigs ? Vec_WrdSize(p->vConfigs) : 0;
    fwrite( &Num, 4, 1, pFile );
    if ( Num )
        fwrite( Vec_WrdArray(p->vConfigs), sizeof(word)*Num, 1, pFile );
    Num = p->pCellStr ? strlen(p->pCellStr) : 0;
    fwrite( &Num, 4, 1, pFile );
    if ( Num )
        fwrite( p->pCellStr, sizeof(char)*Num, 1, pFile );
    fclose( pFile );
}